

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

size_t __thiscall cnn::Max::aux_storage_size(Max *this)

{
  uint uVar1;
  
  uVar1 = Dim::size(&(this->super_Node).dim);
  return (ulong)uVar1 << 2;
}

Assistant:

size_t Max::aux_storage_size() const {
  return dim.size() * sizeof(float);
}